

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

void __thiscall luna::VM::Concat(VM *this,Value *dst,Value *op1,Value *op2)

{
  State *pSVar1;
  CFunctionType p_Var2;
  String *pSVar3;
  RuntimeException *this_00;
  code *pcVar4;
  pair<const_char_*,_int> pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (op1->type_ == ValueT_Number) {
    if (op2->type_ == ValueT_String) {
      pSVar1 = this->state_;
      (anonymous_namespace)::NumberToStr_abi_cxx11_(&local_50,(_anonymous_namespace_ *)op1,op1);
      p_Var2 = (op2->field_0).cfunc_;
      if (p_Var2[0x11] == (_func_int_State_ptr)0x0) {
        pcVar4 = p_Var2 + 0x18;
      }
      else {
        pcVar4 = *(code **)(p_Var2 + 0x18);
      }
      std::operator+(&local_70,&local_50,(char *)pcVar4);
      pSVar3 = State::GetString(pSVar1,&local_70);
      goto LAB_001687e2;
    }
  }
  else if (op1->type_ == ValueT_String) {
    if (op2->type_ == ValueT_Number) {
      p_Var2 = (op1->field_0).cfunc_;
      if (p_Var2[0x11] == (_func_int_State_ptr)0x0) {
        pcVar4 = p_Var2 + 0x18;
      }
      else {
        pcVar4 = *(code **)(p_Var2 + 0x18);
      }
      pSVar1 = this->state_;
      (anonymous_namespace)::NumberToStr_abi_cxx11_(&local_50,(_anonymous_namespace_ *)op2,op1);
      std::operator+(&local_70,(char *)pcVar4,&local_50);
      pSVar3 = State::GetString(pSVar1,&local_70);
    }
    else {
      if (op2->type_ != ValueT_String) goto LAB_0016880f;
      pSVar1 = this->state_;
      String::GetStdString_abi_cxx11_(&local_50,(op1->field_0).str_);
      p_Var2 = (op2->field_0).cfunc_;
      if (p_Var2[0x11] == (_func_int_State_ptr)0x0) {
        pcVar4 = p_Var2 + 0x18;
      }
      else {
        pcVar4 = *(code **)(p_Var2 + 0x18);
      }
      std::operator+(&local_70,&local_50,(char *)pcVar4);
      pSVar3 = State::GetString(pSVar1,&local_70);
    }
LAB_001687e2:
    (dst->field_0).str_ = pSVar3;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    dst->type_ = ValueT_String;
    return;
  }
LAB_0016880f:
  pVar5 = GetCurrentInstructionPos(this);
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
  RuntimeException::RuntimeException(this_00,pVar5.first,pVar5.second,op1,op2,"concat");
  __cxa_throw(this_00,&RuntimeException::typeinfo,Exception::~Exception);
}

Assistant:

void VM::Concat(Value *dst, Value *op1, Value *op2)
    {
        if (op1->type_ == ValueT_String && op2->type_ == ValueT_String)
        {
            dst->str_ = state_->GetString(op1->str_->GetStdString() +
                                          op2->str_->GetCStr());
        }
        else if (op1->type_ == ValueT_String && op2->type_ == ValueT_Number)
        {
            dst->str_ = state_->GetString(op1->str_->GetCStr() +
                                          NumberToStr(op2));
        }
        else if (op1->type_ == ValueT_Number && op2->type_ == ValueT_String)
        {
            dst->str_ = state_->GetString(NumberToStr(op1) +
                                          op2->str_->GetCStr());
        }
        else
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second, op1, op2, "concat");
        }

        dst->type_ = ValueT_String;
    }